

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

ON_XMLProperty * __thiscall
ON_XMLNodePropertyIteratorPrivate::GetNextPropertySorted(ON_XMLNodePropertyIteratorPrivate *this)

{
  pointer pOVar1;
  pointer pOVar2;
  long lVar3;
  int iVar4;
  vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *pvVar5;
  value_type *__x;
  ulong uVar6;
  int iVar7;
  recursive_mutex *__mutex;
  ON_XMLProperty *pOVar8;
  PropertyIterator pi;
  PropertyIterator local_30;
  
  if (this->m_iIndex == 0) {
    __mutex = &this->m_pNode->_private->m_mutex;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    ON_XMLNode::PropertyIterator::PropertyIterator(&local_30,this->m_pNode,false);
    ON_REMOVE_ASAP_AssertEx
              ((uint)(this->m_paSortedProperties ==
                     (vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *)0x0),
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
               ,0xe55,"","m_paSortedProperties == nullptr is false");
    pvVar5 = (vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *)operator_new(0x18);
    (pvVar5->super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar5->super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar5->super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->m_paSortedProperties = pvVar5;
    do {
      if ((local_30._private)->m_bSorted == true) {
        __x = GetNextPropertySorted(local_30._private);
        if (__x == (ON_XMLProperty *)0x0) goto LAB_0068cc14;
      }
      else {
        __x = (local_30._private)->m_pCurrent;
        if (__x == (value_type *)0x0) goto LAB_0068cc14;
        (local_30._private)->m_pCurrent = __x->_private->_next;
      }
      std::vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>::push_back
                (this->m_paSortedProperties,__x);
    } while( true );
  }
LAB_0068cc71:
  pOVar8 = (ON_XMLProperty *)0x0;
  ON_REMOVE_ASAP_AssertEx
            ((uint)(this->m_paSortedProperties !=
                   (vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *)0x0),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
             ,0xe61,"","m_paSortedProperties != nullptr is false");
  iVar4 = this->m_iIndex;
  pOVar1 = (this->m_paSortedProperties->
           super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = (int)((ulong)((long)(this->m_paSortedProperties->
                              super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)pOVar1) >> 3);
  if (SBORROW4(iVar4,iVar7 * -0x3b13b13b) != iVar4 + iVar7 * 0x3b13b13b < 0) {
    this->m_iIndex = iVar4 + 1;
    pOVar8 = pOVar1 + iVar4;
  }
  return pOVar8;
LAB_0068cc14:
  pOVar1 = (this->m_paSortedProperties->
           super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pOVar2 = (this->m_paSortedProperties->
           super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar1 != pOVar2) {
    uVar6 = ((long)pOVar2 - (long)pOVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ON_XMLProperty*,std::vector<ON_XMLProperty,std::allocator<ON_XMLProperty>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pOVar1,pOVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<ON_XMLProperty*,std::vector<ON_XMLProperty,std::allocator<ON_XMLProperty>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pOVar1,pOVar2);
  }
  ON_XMLNode::PropertyIterator::~PropertyIterator(&local_30);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  goto LAB_0068cc71;
}

Assistant:

ON_XMLProperty* GetNextPropertySorted(void)
  {
    // First time through, we build the list.
    if (m_iIndex == 0)
    {
      // While sorting properties, don't allow anything else to access the parent node.
      std::lock_guard<std::recursive_mutex> lg(m_pNode->_private->m_mutex);

      ON_XMLNode::PropertyIterator pi(m_pNode, false);

      ON_ASSERT(m_paSortedProperties == nullptr);
      m_paSortedProperties = new std::vector<ON_XMLProperty>;

      ON_XMLProperty* p = nullptr;
      while (nullptr != (p = pi.GetNextProperty()))
      {
        m_paSortedProperties->push_back(*p);
      }

      std::sort(m_paSortedProperties->begin(), m_paSortedProperties->end());
    }

    ON_ASSERT(m_paSortedProperties != nullptr);

    if (m_iIndex >= int(m_paSortedProperties->size()))
      return nullptr;

    return &(*m_paSortedProperties)[m_iIndex++];
  }